

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O0

void __thiscall
DAnimatedDoor::DAnimatedDoor
          (DAnimatedDoor *this,sector_t *sec,line_t_conflict *line,int speed,int delay,
          FDoorAnimation *anim)

{
  sector_t_conflict *sec_00;
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int local_a0;
  FName local_78;
  int local_74;
  FTexture *local_70;
  FTexture *tex;
  int local_60;
  int local_5c;
  FTextureID local_58 [5];
  FTextureID local_44;
  int local_40;
  FTextureID local_3c;
  int i;
  FTextureID picnum;
  double topdist;
  FDoorAnimation *anim_local;
  int delay_local;
  int speed_local;
  line_t_conflict *line_local;
  sector_t *sec_local;
  DAnimatedDoor *this_local;
  
  DMovingCeiling::DMovingCeiling(&this->super_DMovingCeiling,(sector_t_conflict *)sec,false);
  (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_009f6ee0;
  FTextureID::FTextureID(&local_3c);
  this->m_DoorAnim = anim;
  this->m_Line1 = line;
  this->m_Line2 = line;
  local_40 = 0;
  do {
    if (sec->linecount <= local_40) {
LAB_00547542:
      local_60 = (int)side_t::GetTexture(this->m_Line1->sidedef[0],0);
      local_5c = local_60;
      local_3c = (FTextureID)local_60;
      side_t::SetTexture(this->m_Line1->sidedef[0],1,(FTextureID)local_60);
      tex._4_4_ = local_3c.texnum;
      side_t::SetTexture(this->m_Line2->sidedef[0],1,local_3c);
      local_74 = local_3c.texnum;
      local_70 = FTextureManager::operator[](&TexMan,local_3c);
      if (local_70 == (FTexture *)0x0) {
        local_a0 = 0x40;
      }
      else {
        local_a0 = FTexture::GetScaledHeight(local_70);
      }
      _i = (double)local_a0;
      dVar2 = secplane_t::fD(&((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.
                              m_Sector)->ceilingplane);
      dVar4 = _i;
      dVar3 = secplane_t::fC(&((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.
                              m_Sector)->ceilingplane);
      _i = dVar2 - dVar4 * dVar3;
      this->m_Status = 0;
      this->m_Speed = speed;
      this->m_Delay = delay;
      this->m_Timer = this->m_Speed;
      this->m_Frame = 0;
      this->m_SetBlocking1 = (bool)((byte)this->m_Line1->flags & 1);
      this->m_SetBlocking2 = (bool)((byte)this->m_Line2->flags & 1);
      this->m_Line1->flags = this->m_Line1->flags | 1;
      this->m_Line2->flags = this->m_Line2->flags | 1;
      dVar4 = secplane_t::fD(&((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.
                              m_Sector)->ceilingplane);
      this->m_BotDist = dVar4;
      sector_t::MoveCeiling
                ((sector_t *)(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                 2048.0,_i,1);
      bVar1 = FName::operator!=(&this->m_DoorAnim->OpenSound,NAME_None);
      if (bVar1) {
        sec_00 = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
        FName::FName(&local_78,&this->m_DoorAnim->OpenSound);
        SN_StartSequence((sector_t *)sec_00,4,&local_78,1);
      }
      return;
    }
    if (sec->lines[local_40] != line) {
      local_44 = side_t::GetTexture(sec->lines[local_40]->sidedef[0],0);
      local_58[0] = side_t::GetTexture(line->sidedef[0],0);
      bVar1 = FTextureID::operator==(&local_44,local_58);
      if (bVar1) {
        this->m_Line2 = sec->lines[local_40];
        goto LAB_00547542;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

DAnimatedDoor::DAnimatedDoor (sector_t *sec, line_t *line, int speed, int delay, FDoorAnimation *anim)
	: DMovingCeiling (sec, false)
{
	double topdist;
	FTextureID picnum;

	m_DoorAnim = anim;

	m_Line1 = line;
	m_Line2 = line;

	for (int i = 0; i < sec->linecount; ++i)
	{
		if (sec->lines[i] == line)
			continue;

		if (sec->lines[i]->sidedef[0]->GetTexture(side_t::top) == line->sidedef[0]->GetTexture(side_t::top))
		{
			m_Line2 = sec->lines[i];
			break;
		}
	}


	picnum = m_Line1->sidedef[0]->GetTexture(side_t::top);
	m_Line1->sidedef[0]->SetTexture(side_t::mid, picnum);
	m_Line2->sidedef[0]->SetTexture(side_t::mid, picnum);

	// don't forget texture scaling here!
	FTexture *tex = TexMan[picnum];
	topdist = tex ? tex->GetScaledHeight() : 64;

	topdist = m_Sector->ceilingplane.fD() - topdist * m_Sector->ceilingplane.fC();

	m_Status = Opening;
	m_Speed = speed;
	m_Delay = delay;
	m_Timer = m_Speed;
	m_Frame = 0;
	m_SetBlocking1 = !!(m_Line1->flags & ML_BLOCKING);
	m_SetBlocking2 = !!(m_Line2->flags & ML_BLOCKING);
	m_Line1->flags |= ML_BLOCKING;
	m_Line2->flags |= ML_BLOCKING;
	m_BotDist = m_Sector->ceilingplane.fD();
	m_Sector->MoveCeiling (2048., topdist, 1);
	if (m_DoorAnim->OpenSound != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_INTERIOR, m_DoorAnim->OpenSound, 1);
	}
}